

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::renderCardsInHand(Renderer *this)

{
  Position this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference card_00;
  Card *card;
  const_iterator __end3;
  const_iterator __begin3;
  Cards *__range3;
  Position cardPosition;
  Cards *cards;
  Renderer *this_local;
  
  iVar2 = (*this->context->_vptr_Context[5])();
  cardPosition = (Position)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x80))();
  bVar1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                     cardPosition);
  if (!bVar1) {
    iVar2 = (*this->context->_vptr_Context[0x11])();
    this_00 = cardPosition;
    __range3 = (Cards *)CONCAT44(extraout_var_00,iVar2);
    __end3 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::begin
                       ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                        cardPosition);
    card = (Card *)std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::end
                             ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                               *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                                       *)&card), bVar1) {
      card_00 = __gnu_cxx::
                __normal_iterator<const_solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                ::operator*(&__end3);
      renderCard(this,(Position *)&__range3,card_00);
      __range3 = (Cards *)CONCAT44(__range3._4_4_ + 0x10,__range3._0_4_);
      __gnu_cxx::
      __normal_iterator<const_solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void Renderer::renderCardsInHand() const {
    const auto& cards = context.getSolitaire().getCardsInHand();
    if (not cards.empty()) {
        auto cardPosition = context.getCardsInHandPosition();
        for (const auto& card: cards) {
            renderCard(cardPosition, card);
            cardPosition.y += Layout::uncoveredTableauPileCardsSpacing;
        }
    }
}